

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O2

void Llb_ImgQuantifyFirst(Aig_Man_t *pAig,Vec_Ptr_t *vDdMans,Vec_Ptr_t *vQuant0,int fVerbose)

{
  uint uVar1;
  abctime aVar2;
  DdManager *unique;
  Vec_Int_t *vNodeIds;
  DdNode *pDVar3;
  DdNode *n;
  abctime aVar4;
  abctime time;
  DdNode *pDVar5;
  uint i;
  
  aVar2 = Abc_Clock();
  i = 0;
  while( true ) {
    if (vDdMans->nSize <= (int)i) {
      return;
    }
    unique = (DdManager *)Vec_PtrEntry(vDdMans,i);
    if (unique->bFunc2 != (DdNode *)0x0) break;
    unique->bFunc2 = unique->bFunc;
    Cudd_Ref(unique->bFunc);
    Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
    pDVar5 = unique->bFunc;
    if (fVerbose != 0) {
      pDVar3 = pDVar5;
      uVar1 = Cudd_DagSize(pDVar5);
      Abc_Print((int)pDVar3,"Part %2d : Init =%5d. ",(ulong)i,(ulong)uVar1);
    }
    i = i + 1;
    vNodeIds = (Vec_Int_t *)Vec_PtrEntry(vQuant0,i);
    pDVar3 = Llb_ImgComputeCube(pAig,vNodeIds,unique);
    Cudd_Ref(pDVar3);
    n = Cudd_bddExistAbstract(unique,pDVar5,pDVar3);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(unique,pDVar5);
    Cudd_RecursiveDeref(unique,pDVar3);
    unique->bFunc = n;
    Cudd_AutodynDisable(unique);
    if (fVerbose == 0) {
      Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,100);
    }
    else {
      pDVar5 = n;
      uVar1 = Cudd_DagSize(n);
      Abc_Print((int)pDVar5,"Quant =%5d. ",(ulong)uVar1);
      Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,100);
      pDVar5 = n;
      uVar1 = Cudd_DagSize(n);
      Abc_Print((int)pDVar5,"Reo = %5d. ",(ulong)uVar1);
    }
    Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,100);
    if (fVerbose != 0) {
      pDVar5 = n;
      uVar1 = Cudd_DagSize(n);
      Abc_Print((int)pDVar5,"Reo = %5d.  ",(ulong)uVar1);
      uVar1 = Cudd_SupportSize(unique,n);
      Abc_Print((int)unique,"Supp = %3d.  ",(ulong)uVar1);
      aVar4 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar4 - aVar2),time);
    }
  }
  __assert_fail("dd->bFunc2 == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Image.c"
                ,0x129,"void Llb_ImgQuantifyFirst(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)");
}

Assistant:

void Llb_ImgQuantifyFirst( Aig_Man_t * pAig, Vec_Ptr_t * vDdMans, Vec_Ptr_t * vQuant0, int fVerbose )
{
    DdManager * dd;
    DdNode * bProd, * bRes, * bTemp;
    int i;
    abctime clk = Abc_Clock();
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        // remember unquantified ones
        assert( dd->bFunc2 == NULL );
        dd->bFunc2 = dd->bFunc;   Cudd_Ref( dd->bFunc2 );

        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

        bRes = dd->bFunc;
        if ( fVerbose )
            Abc_Print( 1, "Part %2d : Init =%5d. ", i, Cudd_DagSize(bRes) );
        bProd = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, i+1), dd );   Cudd_Ref( bProd );
        bRes  = Cudd_bddExistAbstract( dd, bTemp = bRes, bProd );                          Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
        dd->bFunc = bRes;

        Cudd_AutodynDisable( dd );

        if ( fVerbose )
            Abc_Print( 1, "Quant =%5d. ", Cudd_DagSize(bRes) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose ) 
            Abc_Print( 1, "Reo = %5d. ", Cudd_DagSize(bRes) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose ) 
            Abc_Print( 1, "Reo = %5d.  ", Cudd_DagSize(bRes) );
        if ( fVerbose ) 
            Abc_Print( 1, "Supp = %3d.  ", Cudd_SupportSize(dd, bRes) );
        if ( fVerbose ) 
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    }
}